

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall
VmaBlockBufferImageGranularity::FinishValidation
          (VmaBlockBufferImageGranularity *this,ValidationContext *ctx)

{
  uint16_t *puVar1;
  uint16_t *ptr;
  RegionInfo *pRVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = true;
  if (0x100 < this->m_BufferImageGranularity) {
    ptr = ctx->pageAllocs;
    uVar3 = 0;
    do {
      if (this->m_RegionCount == uVar3) {
        if (ptr != (uint16_t *)0x0) {
          VmaFree(ctx->allocCallbacks,ptr);
        }
        ctx->pageAllocs = (uint16_t *)0x0;
        return true;
      }
      puVar1 = ptr + uVar3;
      pRVar2 = this->m_RegionInfo + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == pRVar2->allocCount);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool VmaBlockBufferImageGranularity::FinishValidation(ValidationContext& ctx) const
{
    // Check proper page structure
    if (IsEnabled())
    {
        VMA_ASSERT(ctx.pageAllocs != VMA_NULL && "Validation context not initialized!");

        for (uint32_t page = 0; page < m_RegionCount; ++page)
        {
            VMA_VALIDATE(ctx.pageAllocs[page] == m_RegionInfo[page].allocCount);
        }
        vma_delete_array(ctx.allocCallbacks, ctx.pageAllocs, m_RegionCount);
        ctx.pageAllocs = VMA_NULL;
    }
    return true;
}